

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtilities.cpp
# Opt level: O0

String * Rml::StringUtilities::Replace
                   (String *__return_storage_ptr__,String *subject,String *search,String *replace)

{
  ulong uVar1;
  string *psVar2;
  size_t pos;
  String *replace_local;
  String *search_local;
  String *subject_local;
  
  while( true ) {
    uVar1 = ::std::__cxx11::string::find((string *)subject,(ulong)search);
    if (uVar1 == 0xffffffffffffffff) break;
    psVar2 = (string *)::std::__cxx11::string::length();
    ::std::__cxx11::string::replace((ulong)subject,uVar1,psVar2);
    ::std::__cxx11::string::length();
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)subject);
  return __return_storage_ptr__;
}

Assistant:

String StringUtilities::Replace(String subject, const String& search, const String& replace)
{
	size_t pos = 0;
	while ((pos = subject.find(search, pos)) != String::npos)
	{
		subject.replace(pos, search.length(), replace);
		pos += replace.length();
	}
	return subject;
}